

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O3

void __thiscall sigopcount_tests::GetSigOpCount::test_method(GetSigOpCount *this)

{
  uint uVar1;
  undefined1 *puVar2;
  pointer pCVar3;
  uint uVar4;
  CScript *pCVar5;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  int iVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  pointer *__ptr;
  const_iterator cVar11;
  long in_FS_OFFSET;
  bool bVar12;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  undefined4 local_344;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sSerialized_1;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  uint local_29c;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined4 *local_1a0;
  undefined1 local_198 [8];
  undefined4 **local_190;
  char *local_188;
  assertion_result local_180;
  undefined1 local_168 [16];
  shared_count sStack_158;
  undefined8 uStack_150;
  undefined1 local_148 [24];
  undefined8 local_130;
  undefined1 local_128 [24];
  undefined8 uStack_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sSerialized;
  uint160 dummy;
  uchar local_a4 [12];
  undefined1 local_98 [28];
  size_type sStack_7c;
  undefined1 local_78 [28];
  uint uStack_5c;
  undefined1 local_58 [24];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._16_8_ = 0;
  stack0xffffffffffffffa0 = 0;
  local_78._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_78._8_8_ = 0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x23;
  file.m_begin = (iterator)&local_1b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,msg);
  local_98._8_4_ = local_98._8_4_ & 0xffffff00;
  local_98._0_8_ = &PTR__lazy_ostream_01388f08;
  local_98._16_4_ = 0x139d138;
  local_98._20_4_ = 0;
  local_98._24_4_ = 0xf4aea1;
  sStack_7c = 0;
  local_180._0_4_ = CScript::GetSigOpCount((CScript *)local_78,false);
  local_168._0_8_ = &local_180;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_ << 0x20);
  local_128._8_8_ = (element_type *)0x0;
  local_128._16_8_ = (sp_counted_base *)0x0;
  local_148._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_148._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_128[0] = local_180._0_4_ == 0;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)&sSerialized_1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)local_98,1,2,REQUIRE,0xf1bf03,
             (size_t)local_148,0x23,&sSerialized,"0U",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_128 + 0x10));
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x24;
  file_00.m_begin = (iterator)&local_1d0;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e0,
             msg_00);
  local_98._8_4_ = local_98._8_4_ & 0xffffff00;
  local_98._0_8_ = &PTR__lazy_ostream_01388f08;
  local_98._16_4_ = 0x139d138;
  local_98._20_4_ = 0;
  local_98._24_4_ = 0xf4aea1;
  sStack_7c = 0;
  local_180._0_4_ = CScript::GetSigOpCount((CScript *)local_78,true);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_128[0] = local_180._0_4_ == 0;
  local_128._8_8_ = (element_type *)0x0;
  local_128._16_8_ = (sp_counted_base *)0x0;
  local_148._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_148._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  local_168._0_8_ = &local_180;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)&sSerialized_1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)local_98,1,2,REQUIRE,0xf1bf1b,
             (size_t)local_148,0x24,&sSerialized,"0U",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_128 + 0x10));
  dummy.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  uVar4 = uStack_5c - 0x1d;
  if (uStack_5c < 0x1d) {
    uVar4 = uStack_5c;
  }
  dummy.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78._0_8_;
  if (uStack_5c < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78;
  }
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar4),(uchar *)&sSerialized);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,(uchar *)&dummy,
             local_a4,(allocator_type *)local_58);
  b._M_extent._M_extent_value =
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b._M_ptr = sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  pCVar5 = CScript::operator<<((CScript *)local_78,b);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_58,(uchar *)&dummy,
             local_a4,(allocator_type *)local_98);
  b_00._M_extent._M_extent_value = CONCAT44(local_58._12_4_,local_58._8_4_) - local_58._0_8_;
  b_00._M_ptr = (pointer)local_58._0_8_;
  ppVar6 = &CScript::operator<<(pCVar5,b_00)->super_CScriptBase;
  uVar4 = ppVar6->_size;
  uVar1 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar1 = uVar4;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar6->_union).indirect_contents.indirect;
  if (uVar4 < 0x1d) {
    ppVar8 = ppVar6;
  }
  local_98[0] = (allocator_type)0x52;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar8->_union + (long)(int)uVar1),local_98);
  uVar4 = ppVar6->_size;
  uVar1 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar1 = uVar4;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar6->_union).indirect_contents.indirect;
  if (uVar4 < 0x1d) {
    ppVar8 = ppVar6;
  }
  local_98[0] = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar8->_union + (long)(int)uVar1),local_98);
  if ((undefined **)local_58._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_58._0_8_,
                    CONCAT44(local_58._20_4_,local_58._16_4_) - local_58._0_8_);
  }
  if (sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000028;
  file_01.m_begin = (iterator)&local_1f0;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_200,
             msg_01);
  local_98._8_4_ = local_98._8_4_ & 0xffffff00;
  local_98._0_8_ = &PTR__lazy_ostream_01388f08;
  local_98._16_4_ = 0x139d138;
  local_98._20_4_ = 0;
  local_98._24_4_ = 0xf4aea1;
  sStack_7c = 0;
  uVar4 = CScript::GetSigOpCount((CScript *)local_78,true);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,2);
  local_128._8_8_ = (element_type *)0x0;
  local_128._16_8_ = (sp_counted_base *)0x0;
  local_148._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_148._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  local_168._0_8_ = &local_180;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_180._0_4_ = uVar4;
  local_128[0] = uVar4 == 2;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)&sSerialized_1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)local_98,1,2,REQUIRE,0xf1bf1b,
             (size_t)local_148,0x28,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,"2U",
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_128 + 0x10));
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78._0_8_;
  uVar4 = uStack_5c - 0x1d;
  if (uStack_5c < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78;
    uVar4 = uStack_5c;
  }
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,99);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar4),(uchar *)&sSerialized);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78._0_8_;
  uVar4 = uStack_5c - 0x1d;
  if (uStack_5c < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78;
    uVar4 = uStack_5c;
  }
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar4),(uchar *)&sSerialized);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78._0_8_;
  uVar4 = uStack_5c - 0x1d;
  if (uStack_5c < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78;
    uVar4 = uStack_5c;
  }
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0x68);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar4),(uchar *)&sSerialized);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2a;
  file_02.m_begin = (iterator)&local_210;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_220,
             msg_02);
  local_98._8_4_ = local_98._8_4_ & 0xffffff00;
  local_98._0_8_ = &PTR__lazy_ostream_01388f08;
  local_98._16_4_ = 0x139d138;
  local_98._20_4_ = 0;
  local_98._24_4_ = 0xf4aea1;
  sStack_7c = 0;
  local_180._0_4_ = CScript::GetSigOpCount((CScript *)local_78,true);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,3);
  local_128[0] = local_180._0_4_ == 3;
  local_128._8_8_ = (element_type *)0x0;
  local_128._16_8_ = (sp_counted_base *)0x0;
  local_148._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_148._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  local_168._0_8_ = &local_180;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)&sSerialized_1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)local_98,1,2,REQUIRE,0xf1bf1b,
             (size_t)local_148,0x2a,&sSerialized,"3U",
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_128 + 0x10));
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x2b;
  file_03.m_begin = (iterator)&local_230;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_240,
             msg_03);
  local_98._8_4_ = local_98._8_4_ & 0xffffff00;
  local_98._0_8_ = &PTR__lazy_ostream_01388f08;
  local_98._16_4_ = 0x139d138;
  local_98._20_4_ = 0;
  local_98._24_4_ = 0xf4aea1;
  sStack_7c = 0;
  local_180._0_4_ = CScript::GetSigOpCount((CScript *)local_78,false);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0x15);
  local_128[0] = local_180._0_4_ == 0x15;
  local_128._8_8_ = (element_type *)0x0;
  local_128._16_8_ = (sp_counted_base *)0x0;
  local_148._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_148._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  local_168._0_8_ = &local_180;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)&sSerialized_1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)local_98,1,2,REQUIRE,0xf1bf03,
             (size_t)local_148,0x2b,&sSerialized,"21U",
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_128 + 0x10));
  ScriptHash::ScriptHash((ScriptHash *)local_58,(CScript *)local_78);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,local_58._16_4_);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)CONCAT44(local_58._12_4_,local_58._8_4_);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
  GetScriptForDestination((CScript *)local_98,(CTxDestination *)&sSerialized);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&sSerialized);
  local_128._16_8_ = (sp_counted_base *)0x0;
  uStack_110 = 0;
  local_128._0_8_ = (char *)0x0;
  local_128._8_8_ = (element_type *)0x0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_128,(iterator)local_128,
             (uchar *)&sSerialized);
  cVar11.ptr = (uchar *)local_78;
  uVar4 = uStack_5c;
  if (0x1c < uStack_5c) {
    cVar11.ptr = (uchar *)local_78._0_8_;
    uVar4 = uStack_5c - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,cVar11,
             (const_iterator)(cVar11.ptr + (int)uVar4),(allocator_type *)local_58);
  b_01._M_extent._M_extent_value =
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_01._M_ptr = sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  CScript::operator<<((CScript *)local_128,b_01);
  if (sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x30;
  file_04.m_begin = (iterator)&local_250;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_260,
             msg_04);
  local_148._8_8_ = local_148._8_8_ & 0xffffffffffffff00;
  local_148._0_8_ = &PTR__lazy_ostream_01388f08;
  local_148._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  uVar4 = CScript::GetSigOpCount((CScript *)local_98,(CScript *)local_128);
  local_180._0_8_ = &local_190;
  local_190 = (undefined4 **)CONCAT44(local_190._4_4_,uVar4);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_198;
  local_198._0_4_ = 3;
  local_168[0] = uVar4 == 3;
  local_168._8_8_ = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  local_40 = &keys;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,2,REQUIRE,0xf1bf32,
             (size_t)&sSerialized_1,0x30,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,"3U",
             (allocator_type *)local_58);
  boost::detail::shared_count::~shared_count(&sStack_158);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar7 = 3;
  do {
    GenerateRandomKey(SUB81((CKey *)local_58,0));
    CKey::GetPubKey((CPubKey *)&sSerialized,(CKey *)local_58);
    pCVar3 = keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<CPubKey,_std::allocator<CPubKey>_>::_M_realloc_insert<CPubKey>
                (&keys,(iterator)
                       keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish,(CPubKey *)&sSerialized);
    }
    else {
      memcpy(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish,(CPubKey *)&sSerialized,0x41);
      keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
      _M_finish = pCVar3 + 1;
    }
    if ((array<unsigned_char,_32UL> *)CONCAT44(local_58._12_4_,local_58._8_4_) !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)(local_58 + 8),
                 (array<unsigned_char,_32UL> *)CONCAT44(local_58._12_4_,local_58._8_4_));
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  GetScriptForMultisig((CScript *)local_148,1,&keys);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x39;
  file_05.m_begin = (iterator)&local_288;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_298,
             msg_05);
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_01388f08;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_150 = "";
  local_1a0._0_4_ = CScript::GetSigOpCount((CScript *)local_148,true);
  local_190 = &local_1a0;
  local_198 = (undefined1  [8])&local_29c;
  local_29c = 3;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,(uint)local_1a0 == 3);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_180.m_message.px = (element_type *)0xf1bef4;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)local_198;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sSerialized_1,(lazy_ostream *)local_168,1,2,REQUIRE,0xf1bf50,
             (size_t)&local_180,0x39,(CPubKey *)&sSerialized,"3U",(CKey *)local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x3a;
  file_06.m_begin = (iterator)&local_2b0;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2c0,
             msg_06);
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_01388f08;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_150 = "";
  uVar4 = CScript::GetSigOpCount((CScript *)local_148,false);
  local_1a0 = (undefined4 *)CONCAT44(local_1a0._4_4_,uVar4);
  local_29c = 0x14;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,uVar4 == 0x14);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_180.m_message.px = (element_type *)0xf1bef4;
  local_190 = &local_1a0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_198 = (undefined1  [8])&local_29c;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)local_198;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sSerialized_1,(lazy_ostream *)local_168,1,2,REQUIRE,0xf1bf67,
             (size_t)&local_180,0x3a,(CPubKey *)&sSerialized,"20U",(CKey *)local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ScriptHash::ScriptHash((ScriptHash *)local_168,(CScript *)local_148);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,sStack_158.pi_._0_4_);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_168._0_8_;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_168._8_8_;
  GetScriptForDestination((CScript *)local_58,(CTxDestination *)&sSerialized);
  puVar2 = (undefined1 *)local_40;
  if (0x1c < sStack_7c) {
    free((void *)local_98._0_8_);
    puVar2 = (undefined1 *)local_40;
  }
  local_40._0_4_ = SUB84(puVar2,0);
  local_98._16_4_ = local_58._16_4_;
  local_98._20_4_ = local_58._20_4_;
  local_98._0_8_ = local_58._0_8_;
  local_98._8_4_ = local_58._8_4_;
  local_40._4_4_ = 0;
  unique0x10001ed2 = puVar2;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&sSerialized);
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x3d;
  file_07.m_begin = (iterator)&local_2d0;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e0,
             msg_07);
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_01388f08;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_150 = "";
  uVar4 = CScript::GetSigOpCount((CScript *)local_98,true);
  local_29c = 0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,uVar4 == 0);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_180.m_message.px = (element_type *)0xf1bef4;
  local_190 = &local_1a0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_198 = (undefined1  [8])&local_29c;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)local_198;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_1a0._0_4_ = uVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sSerialized_1,(lazy_ostream *)local_168,1,2,REQUIRE,0xf1bf7f,
             (size_t)&local_180,0x3d,
             (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)&sSerialized,"0U",(CScript *)local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x3e;
  file_08.m_begin = (iterator)&local_2f0;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_300,
             msg_08);
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_01388f08;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_150 = "";
  uVar4 = CScript::GetSigOpCount((CScript *)local_98,false);
  local_1a0 = (undefined4 *)CONCAT44(local_1a0._4_4_,uVar4);
  local_29c = 0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,uVar4 == 0);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_180.m_message.px = (element_type *)0xf1bef4;
  local_190 = &local_1a0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_198 = (undefined1  [8])&local_29c;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)local_198;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sSerialized_1,(lazy_ostream *)local_168,1,2,REQUIRE,0xf1bf98,
             (size_t)&local_180,0x3e,
             (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)&sSerialized,"0U",(CScript *)local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  sStack_158.pi_ = (sp_counted_base *)0x0;
  uStack_150 = (char *)0x0;
  local_168._0_8_ = (_func_int **)0x0;
  local_168._8_8_ = (element_type *)0x0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&sSerialized);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,(uchar *)&dummy,
             local_a4,(allocator_type *)local_58);
  b_02._M_extent._M_extent_value =
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_02._M_ptr = sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pCVar5 = CScript::operator<<((CScript *)local_168,b_02);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_58,(uchar *)&dummy,
             local_a4,(allocator_type *)&sSerialized_1);
  b_03._M_extent._M_extent_value = CONCAT44(local_58._12_4_,local_58._8_4_) - local_58._0_8_;
  b_03._M_ptr = (pointer)local_58._0_8_;
  pCVar5 = CScript::operator<<(pCVar5,b_03);
  cVar11.ptr = (uchar *)local_148;
  uVar4 = local_130._4_4_;
  if (0x1c < local_130._4_4_) {
    cVar11.ptr = (uchar *)local_148._0_8_;
    uVar4 = local_130._4_4_ - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized_1,cVar11,
             (const_iterator)(cVar11.ptr + (int)uVar4),(allocator_type *)&local_180);
  b_04._M_extent._M_extent_value =
       (long)sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
  b_04._M_ptr = sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  CScript::operator<<(pCVar5,b_04);
  if (sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sSerialized_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sSerialized_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((undefined **)local_58._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_58._0_8_,
                    CONCAT44(local_58._20_4_,local_58._16_4_) - local_58._0_8_);
  }
  if (sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x41;
  file_09.m_begin = (iterator)&local_310;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_320,
             msg_09);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized_1.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f08;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_29c = CScript::GetSigOpCount((CScript *)local_98,(CScript *)local_168);
  local_1a0 = &local_344;
  local_344 = 3;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_29c == 3);
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_190 = (undefined4 **)0xf1be8b;
  local_188 = "";
  local_198 = (undefined1  [8])&local_29c;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  local_40 = (vector<CPubKey,_std::allocator<CPubKey>_> *)&local_1a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)&sSerialized_1,1,2,REQUIRE,0xf1bfb2,(size_t)&local_190,0x41,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,"3U",
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_58);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  if (0x1c < uStack_150._4_4_) {
    free((void *)local_168._0_8_);
  }
  if (0x1c < local_130._4_4_) {
    free((void *)local_148._0_8_);
  }
  if (keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  puVar2 = unique0x10001445;
  if (0x1c < uStack_110._4_4_) {
    free((void *)local_128._0_8_);
    puVar2 = stack0xffffffffffffff80;
  }
  sStack_7c = (size_type)((ulong)puVar2 >> 0x20);
  bVar12 = 0x1c < sStack_7c;
  unique0x10001eea = puVar2;
  if (bVar12) {
    free((void *)local_98._0_8_);
  }
  if (0x1c < uStack_5c) {
    free((void *)local_78._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(GetSigOpCount)
{
    // Test CScript::GetSigOpCount()
    CScript s1;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(false), 0U);
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 0U);

    uint160 dummy;
    s1 << OP_1 << ToByteVector(dummy) << ToByteVector(dummy) << OP_2 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 2U);
    s1 << OP_IF << OP_CHECKSIG << OP_ENDIF;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 3U);
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(false), 21U);

    CScript p2sh = GetScriptForDestination(ScriptHash(s1));
    CScript scriptSig;
    scriptSig << OP_0 << Serialize(s1);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(scriptSig), 3U);

    std::vector<CPubKey> keys;
    for (int i = 0; i < 3; i++)
    {
        CKey k = GenerateRandomKey();
        keys.push_back(k.GetPubKey());
    }
    CScript s2 = GetScriptForMultisig(1, keys);
    BOOST_CHECK_EQUAL(s2.GetSigOpCount(true), 3U);
    BOOST_CHECK_EQUAL(s2.GetSigOpCount(false), 20U);

    p2sh = GetScriptForDestination(ScriptHash(s2));
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(true), 0U);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(false), 0U);
    CScript scriptSig2;
    scriptSig2 << OP_1 << ToByteVector(dummy) << ToByteVector(dummy) << Serialize(s2);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(scriptSig2), 3U);
}